

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

Bool ParsePickList(TidyDocImpl *doc,TidyOptionImpl *entry)

{
  Bool BVar1;
  uint value;
  
  BVar1 = GetParsePickListValue(doc,entry,&value);
  if (BVar1 == no) {
    prvTidyReportBadArgument(doc,entry->name);
    BVar1 = no;
  }
  else {
    BVar1 = yes;
    if (entry->type == TidyInteger) {
      prvTidySetOptionInt(doc,entry->id,(ulong)value);
    }
    else if (entry->type == TidyBoolean) {
      prvTidySetOptionBool(doc,entry->id,value);
    }
  }
  return BVar1;
}

Assistant:

Bool ParsePickList( TidyDocImpl* doc, const TidyOptionImpl* entry )
{
    uint value;
    
    if ( GetParsePickListValue( doc, entry, &value ) )
    {
        if ( entry->type == TidyBoolean )
            TY_(SetOptionBool)( doc, entry->id, value );
        else if ( entry->type == TidyInteger )
            TY_(SetOptionInt)( doc, entry->id, value );
        return yes;
    }
  
    TY_(ReportBadArgument)( doc, entry->name );
    return no;
}